

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::AddScriptHashSignTxInRequest::AddScriptHashSignTxInRequest
          (AddScriptHashSignTxInRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  (this->super_JsonClassBase<cfd::js::api::json::AddScriptHashSignTxInRequest>)._vptr_JsonClassBase
       = (_func_int **)&PTR__AddScriptHashSignTxInRequest_00b3b238;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->txid_,"",&local_29);
  this->vout_ = 0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::SignData>.
  super_vector<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  super__Vector_base<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::SignData>.
  super_vector<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  super__Vector_base<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::SignData>.
  super_vector<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  super__Vector_base<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sign_params_).super_JsonVector<cfd::js::api::json::SignData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b3ad68;
  (this->sign_param_).super_JsonVector<cfd::js::api::json::SignData>.
  super_vector<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  super__Vector_base<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sign_param_).super_JsonVector<cfd::js::api::json::SignData>.
  super_vector<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  super__Vector_base<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sign_param_).super_JsonVector<cfd::js::api::json::SignData>.
  super_vector<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  super__Vector_base<cfd::js::api::json::SignData,_std::allocator<cfd::js::api::json::SignData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sign_param_).super_JsonVector<cfd::js::api::json::SignData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b3ad68;
  std::__cxx11::string::string((string *)&this->redeem_script_,"",&local_2a);
  std::__cxx11::string::string((string *)&this->hash_type_,"",&local_2b);
  CollectFieldName();
  return;
}

Assistant:

AddScriptHashSignTxInRequest() {
    CollectFieldName();
  }